

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *old)

{
  undefined8 *puVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  undefined8 uVar4;
  QDnsCachedName *data;
  QDnsCachedName *pQVar5;
  qsizetype qVar6;
  QDnsCachedName *pQVar7;
  long lVar8;
  Int IVar9;
  long lVar10;
  Data *pDVar11;
  QDnsCachedName *pQVar12;
  long lVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  QArrayData *d;
  QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> local_58;
  QArrayData *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = &this->d->super_QArrayData;
  if (where == GrowsAtEnd) {
    if (pQVar2 != (QArrayData *)0x0) {
      if ((0 < n) && ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
        auVar14 = QArrayData::reallocateUnaligned
                            (pQVar2,this->ptr,0x20,
                             this->size +
                             ((long)((long)this->ptr -
                                    ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >>
                             5) + 1,Grow);
        this->d = (Data *)auVar14._0_8_;
        this->ptr = (QDnsCachedName *)auVar14._8_8_;
        goto LAB_00233908;
      }
      qVar6 = pQVar2->alloc;
      lVar8 = this->size;
      lVar10 = lVar8;
      if (lVar8 - qVar6 == 0 || lVar8 < qVar6) {
        lVar10 = qVar6;
      }
      lVar8 = ((long)((long)this->ptr - ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0))
              >> 5) + lVar10 + n + (lVar8 - qVar6);
      goto LAB_00233738;
    }
    qVar6 = 0;
    lVar8 = this->size;
    if (this->size < 1) {
      lVar8 = qVar6;
    }
    lVar8 = lVar8 + n;
  }
  else {
    if (pQVar2 == (QArrayData *)0x0) {
      qVar6 = 0;
    }
    else {
      qVar6 = pQVar2->alloc;
    }
    if (qVar6 < this->size) {
      qVar6 = this->size;
    }
    lVar8 = (long)((long)this->ptr - ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >>
            5;
    if (pQVar2 == (QArrayData *)0x0) {
      lVar8 = 0;
    }
    lVar8 = (qVar6 + n) - lVar8;
    if (pQVar2 == (QArrayData *)0x0) {
      qVar6 = 0;
    }
    else {
      qVar6 = pQVar2->alloc;
LAB_00233738:
      lVar10 = lVar8;
      if (lVar8 < qVar6) {
        lVar10 = qVar6;
      }
      if (((pQVar2->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
        lVar8 = lVar10;
      }
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QDnsCachedName *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = (QDnsCachedName *)QArrayData::allocate(&local_38,0x20,0x10,lVar8,(uint)(lVar8 <= qVar6));
  if (pQVar5 != (QDnsCachedName *)0x0 && local_38 != (QArrayData *)0x0) {
    if (where == GrowsAtBeginning) {
      lVar10 = (local_38->alloc - (this->size + n)) / 2;
      lVar8 = 0;
      if (0 < lVar10) {
        lVar8 = lVar10;
      }
      lVar8 = lVar8 + n;
      pDVar11 = this->d;
    }
    else {
      pDVar11 = this->d;
      lVar8 = (long)((long)this->ptr -
                    ((ulong)((long)&pDVar11[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
              >> 5;
      if (pDVar11 == (Data *)0x0) {
        lVar8 = 0;
      }
    }
    if (pDVar11 == (Data *)0x0) {
      IVar9 = 0;
    }
    else {
      IVar9 = (pDVar11->super_QArrayData).flags.
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
    pQVar5 = pQVar5 + lVar8;
    (local_38->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar9;
  }
  local_58.size = 0;
  lVar8 = this->size;
  if (lVar8 == 0) {
LAB_002338dd:
    lVar10 = 0;
  }
  else if ((this->d == (Data *)0x0) ||
          (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    if (lVar8 < 1) goto LAB_002338dd;
    pQVar7 = this->ptr;
    pQVar12 = pQVar7 + lVar8;
    do {
      pDVar3 = (pQVar7->name).d.d;
      pQVar5[local_58.size].name.d.d = pDVar3;
      pQVar5[local_58.size].name.d.ptr = (pQVar7->name).d.ptr;
      pQVar5[local_58.size].name.d.size = (pQVar7->name).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pQVar5[local_58.size].code = pQVar7->code;
      pQVar7 = pQVar7 + 1;
      lVar10 = local_58.size + 1;
      local_58.size = lVar10;
    } while (pQVar7 < pQVar12);
  }
  else {
    if (lVar8 < 1) goto LAB_002338dd;
    pQVar7 = this->ptr;
    lVar13 = 0;
    lVar10 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(pQVar7->name).d.d + lVar13);
      uVar4 = *puVar1;
      *puVar1 = 0;
      *(undefined8 *)((long)&(pQVar5->name).d.d + lVar13) = uVar4;
      uVar4 = puVar1[1];
      puVar1[1] = 0;
      *(undefined8 *)((long)&(pQVar5->name).d.ptr + lVar13) = uVar4;
      uVar4 = puVar1[2];
      puVar1[2] = 0;
      *(undefined8 *)((long)&(pQVar5->name).d.size + lVar13) = uVar4;
      *(undefined4 *)((long)&pQVar5->code + lVar13) = *(undefined4 *)(puVar1 + 3);
      lVar10 = lVar10 + 1;
      lVar13 = lVar13 + 0x20;
    } while ((QDnsCachedName *)(puVar1 + 4) < pQVar7 + lVar8);
  }
  local_58.d = this->d;
  this->d = (Data *)local_38;
  local_58.ptr = this->ptr;
  this->ptr = pQVar5;
  local_58.size = this->size;
  this->size = lVar10;
  ~QArrayDataPointer(&local_58);
LAB_00233908:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }